

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O2

int get_test_set(int *test_set,int limit,char *test,test_list_t *tests)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  
  if (test == (char *)0x0) {
    uVar4 = 0;
    uVar9 = 0;
    if (0 < limit) {
      uVar9 = (ulong)(uint)limit;
    }
    for (; uVar3 = limit, uVar9 != uVar4; uVar4 = uVar4 + 1) {
      test_set[uVar4] = (int)uVar4;
    }
  }
  else {
    cVar10 = *test;
    if (9 < (byte)(cVar10 - 0x30U)) {
      uVar9 = 0;
      uVar4 = (ulong)(uint)limit;
      if (limit < 1) {
        uVar4 = uVar9;
      }
      uVar13 = 0;
LAB_00103578:
      if (uVar9 != uVar4) {
        pcVar14 = tests[uVar9].name;
        cVar10 = *test;
        pcVar11 = test + (cVar10 == '^');
        do {
          cVar8 = *pcVar11;
          if (cVar8 != '\\') {
            if (cVar8 != '*') goto LAB_001035e8;
            while (pcVar12 = pcVar11 + 1, cVar8 == '*') {
              pcVar11 = pcVar12;
              cVar8 = *pcVar12;
            }
            if (cVar8 == '\\') {
              cVar8 = *pcVar12;
              pcVar11 = pcVar12;
            }
            pcVar14 = strchr(pcVar14,(int)cVar8);
            if (pcVar14 != (char *)0x0) goto LAB_001035e8;
LAB_001035f8:
            bVar2 = false;
            bVar1 = true;
            goto LAB_00103604;
          }
          cVar8 = pcVar11[1];
          pcVar11 = pcVar11 + 1;
LAB_001035e8:
          if (cVar8 != *pcVar14) goto LAB_001035f8;
          if (cVar8 == '\0') goto LAB_001035ff;
          pcVar11 = pcVar11 + 1;
          pcVar14 = pcVar14 + 1;
        } while( true );
      }
      goto LAB_00103689;
    }
    pcVar14 = test + 2;
    iVar5 = 0;
    while ((byte)(cVar10 - 0x30U) < 10) {
      iVar5 = (uint)(byte)(cVar10 - 0x30U) + iVar5 * 10;
      pcVar11 = pcVar14 + -1;
      pcVar14 = pcVar14 + 1;
      cVar10 = *pcVar11;
    }
    uVar3 = 0xffffffff;
    iVar7 = iVar5;
    if (cVar10 != '\0') {
      if (cVar10 != '-') {
        return -1;
      }
      cVar10 = pcVar14[-1];
      if (cVar10 == '\0') {
        iVar7 = limit + -1;
      }
      else {
        iVar7 = 0;
        while ((byte)(cVar10 - 0x30U) < 10) {
          iVar7 = (uint)(byte)(cVar10 - 0x30U) + iVar7 * 10;
          cVar10 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        }
      }
    }
    if (((-1 < iVar5) && (iVar7 < limit)) && (iVar5 <= iVar7)) {
      for (uVar13 = 0; iVar6 = iVar5 + (int)uVar13, iVar6 <= iVar7; uVar13 = uVar13 + 1) {
        test_set[uVar13] = iVar6;
      }
LAB_00103689:
      uVar3 = -(uint)((uint)uVar13 == 0) | (uint)uVar13;
    }
  }
  return uVar3;
LAB_001035ff:
  bVar1 = false;
  bVar2 = true;
LAB_00103604:
  if (cVar10 != '^') {
    bVar1 = bVar2;
  }
  if (bVar1) {
    iVar5 = (int)uVar13;
    uVar13 = (ulong)(iVar5 + 1);
    test_set[iVar5] = (int)uVar9;
  }
  uVar9 = uVar9 + 1;
  goto LAB_00103578;
}

Assistant:

int get_test_set(int *test_set, int limit, const char *test,
	struct test_list_t *tests)
{
	int start, end;
	int idx = 0;

	if (test == NULL) {
		/* Default: Run all tests. */
		for (;idx < limit; idx++)
			test_set[idx] = idx;
		return (limit);
	}
	if (*test >= '0' && *test <= '9') {
		const char *vp = test;
		start = 0;
		while (*vp >= '0' && *vp <= '9') {
			start *= 10;
			start += *vp - '0';
			++vp;
		}
		if (*vp == '\0') {
			end = start;
		} else if (*vp == '-') {
			++vp;
			if (*vp == '\0') {
				end = limit - 1;
			} else {
				end = 0;
				while (*vp >= '0' && *vp <= '9') {
					end *= 10;
					end += *vp - '0';
					++vp;
				}
			}
		} else
			return (-1);
		if (start < 0 || end >= limit || start > end)
			return (-1);
		while (start <= end)
			test_set[idx++] = start++;
	} else {
		for (start = 0; start < limit; ++start) {
			const char *name = tests[start].name;
			if (test_filter(test, name))
				test_set[idx++] = start;
		}
	}
	return ((idx == 0)?-1:idx);
}